

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ins_ekf.cpp
# Opt level: O2

void __thiscall
ins_ekf::InsEkf::InsEkf
          (InsEkf *this,Vector3d *imu_offset,Vector4d *imu_orientation,Vector3d *gps_offset,
          VectorXd *initial_state,double gps_rate)

{
  double dVar1;
  double dVar2;
  double dVar3;
  DenseBase<Eigen::Matrix<double,_15,_15,_0,_15,_15>_> *xpr;
  VectorXd *vector;
  CommaInitializer<Eigen::Matrix<double,_5,_1,_0,_5,_1>_> *pCVar4;
  Matrix<double,_5,_1,_0,_5,_1> *pMVar5;
  CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *pCVar6;
  Matrix<double,_3,_1,_0,_3,_1> *pMVar7;
  Scalar local_e8;
  Scalar local_e0 [3];
  CommaInitializer<Eigen::Matrix<double,_5,_1,_0,_5,_1>_> local_c8;
  Matrix<double,_3,_1,_0,_3,_1> *local_a8;
  DenseBase<Eigen::Matrix<double,_15,_15,_0,_15,_15>_> *local_a0;
  DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *local_98;
  DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *local_90;
  DenseBase<Eigen::Matrix<double,_11,_1,_0,_11,_1>_> *local_88;
  VectorXd *local_80;
  undefined1 local_78 [24];
  XprTypeNested local_60;
  Scalar local_40;
  Scalar local_38;
  
  this->accel_noise = 0.001;
  this->accel_rw = 0.001;
  this->gyro_noise = 0.00013;
  this->gyro_rw = 0.0001;
  this->gps_update_rate_ = gps_rate;
  local_c8.m_xpr = (Matrix<double,_5,_1,_0,_5,_1> *)local_78;
  local_c8.m_row = 0;
  local_c8.m_col = 1;
  local_c8.m_currentBlockRows = 1;
  local_78._0_8_ = (Matrix<double,_3,_1,_0,_3,_1> *)0x3fb999999999999a;
  local_e0[0] = 0.1;
  local_80 = initial_state;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>::operator_
                     (&local_c8,local_e0);
  local_e8 = 0.1;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>::operator_
                     (pCVar4,&local_e8);
  local_38 = 0.2;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>::operator_
                     (pCVar4,&local_38);
  local_40 = 0.03;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>::operator_
                     (pCVar4,&local_40);
  pMVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>::finished(pCVar4);
  dVar1 = (pMVar5->super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>).m_storage.m_data.
          array[1];
  dVar2 = (pMVar5->super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>).m_storage.m_data.
          array[2];
  dVar3 = (pMVar5->super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>).m_storage.m_data.
          array[3];
  (this->Q_gps_).super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.m_storage.m_data.array
  [0] = (pMVar5->super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>).m_storage.m_data.
        array[0];
  (this->Q_gps_).super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.m_storage.m_data.array
  [1] = dVar1;
  (this->Q_gps_).super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.m_storage.m_data.array
  [2] = dVar2;
  (this->Q_gps_).super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.m_storage.m_data.array
  [3] = dVar3;
  (this->Q_gps_).super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.m_storage.m_data.array
  [4] = (pMVar5->super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>).m_storage.m_data.
        array[4];
  Eigen::CommaInitializer<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>::finished(&local_c8);
  local_78._8_8_ = 0;
  local_78._16_8_ = 1;
  local_60 = (XprTypeNested)0x1;
  local_c8.m_xpr = (Matrix<double,_5,_1,_0,_5,_1> *)0x0;
  local_e0[0] = 0.0;
  local_78._0_8_ = &local_c8;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator_
                     ((CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_78,local_e0);
  local_e8 = 9.81;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator_
                     (pCVar6,&local_e8);
  pMVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::finished(pCVar6);
  dVar1 = (pMVar7->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
          array[1];
  (this->gravity_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
  array[0] = (pMVar7->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data
             .array[0];
  (this->gravity_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
  array[1] = dVar1;
  (this->gravity_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
  array[2] = (pMVar7->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data
             .array[2];
  Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::finished
            ((CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_78);
  vector = local_80;
  this->is_stationary_ = false;
  (this->imu_offset_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
  array[2] = (imu_offset->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
             m_data.array[2];
  dVar1 = (imu_offset->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
          m_data.array[1];
  (this->imu_offset_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
  array[0] = (imu_offset->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
             m_data.array[0];
  (this->imu_offset_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
  array[1] = dVar1;
  dVar1 = (imu_orientation->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage.
          m_data.array[0];
  dVar2 = (imu_orientation->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage.
          m_data.array[1];
  dVar3 = (imu_orientation->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage.
          m_data.array[3];
  (this->imu_orientation_).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
  m_data.array[2] =
       (imu_orientation->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage.
       m_data.array[2];
  (this->imu_orientation_).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
  m_data.array[3] = dVar3;
  (this->imu_orientation_).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
  m_data.array[0] = dVar1;
  (this->imu_orientation_).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
  m_data.array[1] = dVar2;
  (this->gps_offset_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
  array[2] = (gps_offset->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
             m_data.array[2];
  dVar1 = (gps_offset->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
          m_data.array[1];
  (this->gps_offset_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
  array[0] = (gps_offset->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
             m_data.array[0];
  (this->gps_offset_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
  array[1] = dVar1;
  if ((local_80->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows ==
      0xf) {
    local_88 = (DenseBase<Eigen::Matrix<double,_11,_1,_0,_11,_1>_> *)&this->last_measurements_;
    local_a0 = (DenseBase<Eigen::Matrix<double,_15,_15,_0,_15,_15>_> *)&this->P_;
    local_90 = (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&this->bias_a_;
    local_98 = (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&this->bias_g_;
    local_a8 = &this->velocity_;
    Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
              ((VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)local_78,local_80,0,3);
    Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
    PlainObjectBase<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>>
              ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)local_e0,
               (DenseBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_> *)
               local_78);
    RPYToQuat((Vector4d *)&local_c8,(Vector3d *)local_e0);
    (this->orientation_).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
    m_data.array[2] = (double)local_c8.m_col;
    (this->orientation_).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
    m_data.array[3] = (double)local_c8.m_currentBlockRows;
    (this->orientation_).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
    m_data.array[0] = (double)local_c8.m_xpr;
    (this->orientation_).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
    m_data.array[1] = (double)local_c8.m_row;
    Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
              ((VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)local_78,vector,3,3);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>>
              (&this->position_,
               (Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false> *)local_78);
    Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
              ((VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)local_78,vector,6,3);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>>
              (local_a8,(Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false> *)local_78);
    Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::setZero(local_98);
    Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::setZero(local_90);
    xpr = local_a0;
    Eigen::DenseBase<Eigen::Matrix<double,_15,_15,_0,_15,_15>_>::setZero(local_a0);
    local_e0[0] = 10.0;
    Eigen::MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::Identity();
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                      *)&local_c8,local_e0,(StorageBaseType *)&local_e8);
    Eigen::Block<Eigen::Matrix<double,_15,_15,_0,_15,_15>,_-1,_-1,_false>::Block
              ((Block<Eigen::Matrix<double,_15,_15,_0,_15,_15>,__1,__1,_false> *)local_78,
               (Matrix<double,_15,_15,_0,_15,_15> *)xpr,3,3,3,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,15,15,0,15,15>,_1,_1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,3,3,0,3,3>>const>>
              ((Block<Eigen::Matrix<double,_15,_15,_0,_15,_15>,__1,__1,_false> *)local_78,
               (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                *)&local_c8);
    local_e0[0] = 0.008;
    Eigen::MatrixBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::Identity();
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_2,_0,_2,_2>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_2,_2,_0,_2,_2>_>_>
                      *)&local_c8,local_e0,(StorageBaseType *)&local_e8);
    Eigen::Block<Eigen::Matrix<double,_15,_15,_0,_15,_15>,_-1,_-1,_false>::Block
              ((Block<Eigen::Matrix<double,_15,_15,_0,_15,_15>,__1,__1,_false> *)local_78,
               (Matrix<double,_15,_15,_0,_15,_15> *)xpr,0,0,2,2);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,15,15,0,15,15>,_1,_1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,2,0,2,2>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,2,2,0,2,2>>const>>
              ((Block<Eigen::Matrix<double,_15,_15,_0,_15,_15>,__1,__1,_false> *)local_78,
               (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_2,_0,_2,_2>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_2,_2,_0,_2,_2>_>_>
                *)&local_c8);
    (this->P_).super_PlainObjectBase<Eigen::Matrix<double,_15,_15,_0,_15,_15>_>.m_storage.m_data.
    array[0x20] = 0.03;
    local_e0[0] = 0.1;
    Eigen::MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::Identity();
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                      *)&local_c8,local_e0,(StorageBaseType *)&local_e8);
    Eigen::Block<Eigen::Matrix<double,_15,_15,_0,_15,_15>,_-1,_-1,_false>::Block
              ((Block<Eigen::Matrix<double,_15,_15,_0,_15,_15>,__1,__1,_false> *)local_78,
               (Matrix<double,_15,_15,_0,_15,_15> *)xpr,6,6,3,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,15,15,0,15,15>,_1,_1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,3,3,0,3,3>>const>>
              ((Block<Eigen::Matrix<double,_15,_15,_0,_15,_15>,__1,__1,_false> *)local_78,
               (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                *)&local_c8);
    local_e0[0] = 1e-07;
    Eigen::MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::Identity();
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                      *)&local_c8,local_e0,(StorageBaseType *)&local_e8);
    Eigen::Block<Eigen::Matrix<double,_15,_15,_0,_15,_15>,_-1,_-1,_false>::Block
              ((Block<Eigen::Matrix<double,_15,_15,_0,_15,_15>,__1,__1,_false> *)local_78,
               (Matrix<double,_15,_15,_0,_15,_15> *)xpr,9,9,3,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,15,15,0,15,15>,_1,_1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,3,3,0,3,3>>const>>
              ((Block<Eigen::Matrix<double,_15,_15,_0,_15,_15>,__1,__1,_false> *)local_78,
               (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                *)&local_c8);
    local_e0[0] = 1e-08;
    Eigen::MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::Identity();
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                      *)&local_c8,local_e0,(StorageBaseType *)&local_e8);
    Eigen::Block<Eigen::Matrix<double,_15,_15,_0,_15,_15>,_-1,_-1,_false>::Block
              ((Block<Eigen::Matrix<double,_15,_15,_0,_15,_15>,__1,__1,_false> *)local_78,
               (Matrix<double,_15,_15,_0,_15,_15> *)xpr,0xc,0xc,3,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,15,15,0,15,15>,_1,_1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,3,3,0,3,3>>const>>
              ((Block<Eigen::Matrix<double,_15,_15,_0,_15,_15>,__1,__1,_false> *)local_78,
               (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                *)&local_c8);
    Eigen::DenseBase<Eigen::Matrix<double,_11,_1,_0,_11,_1>_>::setZero(local_88);
    return;
  }
  __assert_fail("initial_state.size() == s_I(SI::NUM_STATES)",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/KWoiceshyn[P]ins_ekf/src/ins_ekf.cpp"
                ,0x14,
                "ins_ekf::InsEkf::InsEkf(const Eigen::Vector3d &, const Eigen::Vector4d &, const Eigen::Vector3d &, Eigen::VectorXd, double)"
               );
}

Assistant:

InsEkf::InsEkf(const Eigen::Vector3d& imu_offset, const Eigen::Vector4d& imu_orientation, const Eigen::Vector3d& gps_offset, Eigen::VectorXd initial_state, double gps_rate):
            imu_offset_{imu_offset},
            imu_orientation_{imu_orientation},
            gps_offset_{gps_offset},
            gps_update_rate_{gps_rate},
            Q_gps_{(Eigen::Matrix<double, 5, 1>() << 0.1, 0.1, 0.1, 0.2, 0.03).finished()},
            gravity_{(Eigen::Matrix<double, 3, 1>() << 0.0, 0.0, 9.81).finished()},
            is_stationary_{false}
    {

        assert(initial_state.size() == s_I(SI::NUM_STATES));
        orientation_ = RPYToQuat(initial_state.segment(s_I(SI::roll), 3));
        position_ = initial_state.segment(s_I(SI::x), 3);
        velocity_ = initial_state.segment(s_I(SI::Vx), 3);
        bias_g_.setZero();
        bias_a_.setZero();

        // initialize state covariance matrix
        P_.setZero();
        P_.block(s_I(SI::x), s_I(SI::x), 3, 3) = 10.0 * Eigen::Matrix3d::Identity(); // xyz
        P_.block(s_I(SI::roll), s_I(SI::roll), 2 , 2) = 8e-3 * Eigen::Matrix2d::Identity(); // roll, pitch
        P_(s_I(SI::yaw), s_I(SI::yaw)) = 3e-2; // yaw
        P_.block(s_I(SI::Vx), s_I(SI::Vx), 3 , 3) = 0.1 * Eigen::Matrix3d::Identity(); // Vxyz
        P_.block(s_I(SI::biasGp), s_I(SI::biasGp), 3, 3) = 1e-7 * Eigen::Matrix3d::Identity(); // biasGpqr
        P_.block(s_I(SI::biasAx), s_I(SI::biasAx), 3, 3) = 1e-8 * Eigen::Matrix3d::Identity(); // biasAxyz

        last_measurements_.setZero();
    }